

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_utils.h
# Opt level: O0

void __thiscall
HandleInfoBase<XrExportedLocalizationMapML_T_*,_GenValidUsageXrHandleInfo>::erase
          (HandleInfoBase<XrExportedLocalizationMapML_T_*,_GenValidUsageXrHandleInfo> *this,
          XrExportedLocalizationMapML_T *handle)

{
  bool bVar1;
  allocator local_91;
  string local_90 [32];
  _Node_iterator_base<std::pair<XrExportedLocalizationMapML_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_false>
  local_70;
  _Node_iterator_base<std::pair<XrExportedLocalizationMapML_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_false>
  local_68;
  iterator entry_returned;
  UniqueLock lock;
  allocator local_39;
  string local_38 [32];
  XrExportedLocalizationMapML_T *local_18;
  XrExportedLocalizationMapML_T *handle_local;
  HandleInfoBase<XrExportedLocalizationMapML_T_*,_GenValidUsageXrHandleInfo> *this_local;
  
  local_18 = handle;
  handle_local = (XrExportedLocalizationMapML_T *)this;
  if (handle == (XrExportedLocalizationMapML_T *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"Null handle passed to HandleInfoBase::erase()",&local_39)
    ;
    reportInternalError((string *)local_38);
  }
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)&entry_returned,&this->dispatch_mutex_);
  local_68._M_cur =
       (__node_type *)
       std::
       unordered_map<XrExportedLocalizationMapML_T_*,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>,_std::hash<XrExportedLocalizationMapML_T_*>,_std::equal_to<XrExportedLocalizationMapML_T_*>,_std::allocator<std::pair<XrExportedLocalizationMapML_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>_>_>
       ::find(&this->info_map_,&local_18);
  local_70._M_cur =
       (__node_type *)
       std::
       unordered_map<XrExportedLocalizationMapML_T_*,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>,_std::hash<XrExportedLocalizationMapML_T_*>,_std::equal_to<XrExportedLocalizationMapML_T_*>,_std::allocator<std::pair<XrExportedLocalizationMapML_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>_>_>
       ::end(&this->info_map_);
  bVar1 = std::__detail::operator==(&local_68,&local_70);
  if (!bVar1) {
    std::
    unordered_map<XrExportedLocalizationMapML_T_*,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>,_std::hash<XrExportedLocalizationMapML_T_*>,_std::equal_to<XrExportedLocalizationMapML_T_*>,_std::allocator<std::pair<XrExportedLocalizationMapML_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>_>_>
    ::erase(&this->info_map_,&local_18);
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&entry_returned);
    return;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_90,"Handle passed to HandleInfoBase::insert() not inserted",&local_91);
  reportInternalError((string *)local_90);
}

Assistant:

inline void HandleInfoBase<HandleType, InfoType>::erase(HandleType handle) {
    if (handle == XR_NULL_HANDLE) {
        reportInternalError("Null handle passed to HandleInfoBase::erase()");
    }
    UniqueLock lock(dispatch_mutex_);
    auto entry_returned = info_map_.find(handle);
    if (entry_returned == info_map_.end()) {
        reportInternalError("Handle passed to HandleInfoBase::insert() not inserted");
    }
    info_map_.erase(handle);
}